

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

void snap_useuv(GCproto *pt,uint8_t *udf)

{
  short sVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((pt->flags & 1) != 0) {
    puVar3 = (uint *)(ulong)(pt->k).ptr32;
    uVar2 = pt->sizekgc;
    for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
      puVar3 = puVar3 + -1;
      uVar5 = (ulong)*puVar3;
      if (*(char *)(uVar5 + 5) == '\a') {
        for (uVar6 = 0; uVar6 < *(byte *)(uVar5 + 0x24); uVar6 = uVar6 + 1) {
          sVar1 = *(short *)((ulong)*(uint *)(uVar5 + 0x14) + uVar6 * 2);
          if (sVar1 < 0) {
            udf[(byte)sVar1] = '\0';
          }
        }
      }
    }
  }
  return;
}

Assistant:

void snap_useuv(GCproto *pt, uint8_t *udf)
{
  /* This is a coarse check, because it's difficult to correlate the lifetime
  ** of slots and closures. But the number of false positives is quite low.
  ** A false positive may cause a slot not to be purged, which is just
  ** a missed optimization.
  */
  if ((pt->flags & PROTO_CHILD)) {
    ptrdiff_t i, j, n = pt->sizekgc;
    GCRef *kr = mref(pt->k, GCRef) - 1;
    for (i = 0; i < n; i++, kr--) {
      GCobj *o = gcref(*kr);
      if (o->gch.gct == ~LJ_TPROTO) {
	for (j = 0; j < gco2pt(o)->sizeuv; j++) {
	  uint32_t v = proto_uv(gco2pt(o))[j];
	  if ((v & PROTO_UV_LOCAL)) {
	    udf[(v & 0xff)] = 0;
	  }
	}
      }
    }
  }
}